

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool parse_view_box(element_t *element,int id,plutovg_rect_t *view_box)

{
  _Bool _Var1;
  float local_50;
  float local_4c;
  float h;
  float w;
  float y;
  float x;
  char *end;
  char *it;
  string_t *value;
  plutovg_rect_t *view_box_local;
  element_t *peStack_18;
  int id_local;
  element_t *element_local;
  
  value = (string_t *)view_box;
  view_box_local._4_4_ = id;
  peStack_18 = element;
  it = (char *)find_attribute(element,id,false);
  if ((string_t *)it == (string_t *)0x0) {
    element_local._7_1_ = false;
  }
  else {
    end = ((string_t *)it)->data;
    _y = end + ((string_t *)it)->length;
    _Var1 = parse_float(&end,_y,&w);
    if (((((!_Var1) || (_Var1 = skip_ws_comma(&end,_y), !_Var1)) ||
         (_Var1 = parse_float(&end,_y,&h), !_Var1)) ||
        ((_Var1 = skip_ws_comma(&end,_y), !_Var1 || (_Var1 = parse_float(&end,_y,&local_4c), !_Var1)
         ))) || ((_Var1 = skip_ws_comma(&end,_y), !_Var1 ||
                 ((_Var1 = parse_float(&end,_y,&local_50), !_Var1 ||
                  (_Var1 = skip_ws(&end,_y), _Var1)))))) {
      element_local._7_1_ = false;
    }
    else if ((local_4c <= 0.0) || (local_50 <= 0.0)) {
      element_local._7_1_ = false;
    }
    else {
      *(float *)&value->data = w;
      *(float *)((long)&value->data + 4) = h;
      *(float *)&value->length = local_4c;
      *(float *)((long)&value->length + 4) = local_50;
      element_local._7_1_ = true;
    }
  }
  return element_local._7_1_;
}

Assistant:

static bool parse_view_box(const element_t* element, int id, plutovg_rect_t* view_box)
{
    const string_t* value = find_attribute(element, id, false);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;

    float x, y, w, h;
    if(!parse_float(&it, end, &x)
        || !skip_ws_comma(&it, end)
        || !parse_float(&it, end, &y)
        || !skip_ws_comma(&it, end)
        || !parse_float(&it, end, &w)
        || !skip_ws_comma(&it, end)
        || !parse_float(&it, end, &h)
        || skip_ws(&it, end)) {
        return false;
    }

    if(w <= 0.f || h <= 0.f)
        return false;
    view_box->x = x;
    view_box->y = y;
    view_box->w = w;
    view_box->h = h;
    return true;
}